

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cpp
# Opt level: O0

string * pbrt::detail::FloatToString_abi_cxx11_(float v)

{
  ulong uVar1;
  string *in_RDI;
  int length;
  StringBuilder result;
  char buf [64];
  DoubleToStringConverter doubleConverter;
  float in_stack_fffffffffffffeec;
  undefined4 uVar2;
  int in_stack_fffffffffffffef4;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff04;
  allocator local_b1;
  int local_b0;
  StringBuilder local_a0;
  char local_88 [72];
  DoubleToStringConverter local_40;
  
  uVar4 = 0;
  uVar3 = 5;
  uVar2 = 5;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_40,0,"Inf","NaN",'e',-6,9,5,5,0);
  double_conversion::StringBuilder::StringBuilder
            ((StringBuilder *)CONCAT44(in_stack_ffffffffffffff04,uVar4),
             (char *)CONCAT44(in_stack_fffffffffffffefc,uVar3),in_stack_fffffffffffffef4);
  double_conversion::DoubleToStringConverter::ToShortestSingle
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffef4,uVar2),
             in_stack_fffffffffffffeec,(StringBuilder *)0x8e4b65);
  local_b0 = double_conversion::StringBuilder::position(&local_a0);
  uVar1 = (ulong)local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_88,uVar1,&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  double_conversion::StringBuilder::~StringBuilder
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffef4,uVar2));
  return in_RDI;
}

Assistant:

std::string FloatToString(float v) {
    double_conversion::DoubleToStringConverter doubleConverter(
        double_conversion::DoubleToStringConverter::NO_FLAGS, "Inf", "NaN", 'e',
        -6 /* decimal_in_shortest_low */, 9 /* decimal_in_shortest_high */,
        5 /* max_leading_padding_zeroes_in_precision_mode */,
        5 /*  max_trailing_padding_zeroes_in_precision_mode */);
    char buf[64];
    double_conversion::StringBuilder result(buf, PBRT_ARRAYSIZE(buf));
    doubleConverter.ToShortestSingle(v, &result);
    int length = result.position();
    return std::string(buf, length);
}